

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

JavascriptArrayBuffer *
Js::JavascriptArrayBuffer::Create(byte *buffer,uint32 length,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this;
  Recycler *pRVar3;
  JavascriptArrayBuffer *this_00;
  undefined4 *puVar4;
  TrackAllocData local_58;
  JavascriptArrayBuffer *local_30;
  JavascriptArrayBuffer *result;
  Recycler *recycler;
  DynamicType *type_local;
  byte *pbStack_10;
  uint32 length_local;
  byte *buffer_local;
  
  recycler = (Recycler *)type;
  type_local._4_4_ = length;
  pbStack_10 = buffer;
  this = Js::Type::GetScriptContext(&type->super_Type);
  pRVar3 = ScriptContext::GetRecycler(this);
  result = (JavascriptArrayBuffer *)pRVar3;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
             ,0x32c);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_58);
  this_00 = (JavascriptArrayBuffer *)new<Memory::Recycler>(0x48,pRVar3,0x4642b0);
  JavascriptArrayBuffer(this_00,pbStack_10,type_local._4_4_,(DynamicType *)recycler);
  local_30 = this_00;
  if (this_00 == (JavascriptArrayBuffer *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x32d,"(result)","result");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  Memory::Recycler::AddExternalMemoryUsage((Recycler *)result,(ulong)type_local._4_4_);
  return local_30;
}

Assistant:

JavascriptArrayBuffer* JavascriptArrayBuffer::Create(byte* buffer, uint32 length, DynamicType * type)
    {
        Recycler* recycler = type->GetScriptContext()->GetRecycler();
        JavascriptArrayBuffer* result = RecyclerNewFinalized(recycler, JavascriptArrayBuffer, buffer, length, type);
        Assert(result);
        recycler->AddExternalMemoryUsage(length);
        return result;
    }